

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.h
# Opt level: O0

void __thiscall nesvis::Gui::~Gui(Gui *this)

{
  Gui *this_local;
  
  MemoryWidget::~MemoryWidget(&this->memory_widget);
  PpuWidget::~PpuWidget(&this->ppu_widget);
  LogWidget::~LogWidget(&this->log_widget);
  return;
}

Assistant:

Gui(n_e_s::nes::Nes *nes, PpuHelper *ppu_helper, Control *control)
            : log_widget(),
              cpu_widget(nes, control),
              ppu_widget(nes, ppu_helper),
              memory_widget(nes) {}